

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

void __thiscall Matrix<Rational>::inverseExt(Matrix<Rational> *this,Matrix<Rational> *ext)

{
  ulong uVar1;
  Rational *pRVar2;
  pointer puVar3;
  uint uVar4;
  uint uVar5;
  matrix_error *this_00;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Rational coeff;
  Rational local_b8;
  Rational local_70;
  
  if (this->N == this->M) {
    if (this->N == ext->M) {
      uVar4 = gauss(this,ext);
      if (uVar4 == this->N) {
        if (uVar4 != 0) {
          uVar6 = (ulong)uVar4;
          do {
            uVar4 = uVar4 - 1;
            uVar1 = uVar6 - 1;
            BigInteger::BigInteger(&local_b8._numerator,1);
            BigInteger::BigInteger(&local_b8._denominator,1);
            iVar7 = (int)uVar1;
            ::operator/(&local_70,&local_b8,
                        this->arr + (ulong)(this->N * iVar7) + (uVar1 & 0xffffffff));
            if (local_b8._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b8._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar9 = (ulong)this->N;
            if (this->N == 0) {
              uVar9 = 0;
            }
            else {
              lVar10 = 0;
              uVar8 = 0;
              do {
                Rational::operator*=
                          ((Rational *)
                           ((long)&this->arr[(int)uVar9 * uVar4]._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar10),&local_70);
                uVar8 = uVar8 + 1;
                uVar9 = (ulong)this->N;
                lVar10 = lVar10 + 0x40;
              } while (uVar8 < uVar9);
            }
            uVar8 = (ulong)ext->N;
            if (ext->N != 0) {
              lVar10 = 0;
              uVar9 = 0;
              do {
                Rational::operator*=
                          ((Rational *)
                           ((long)&ext->arr[(int)uVar8 * uVar4]._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar10),&local_70);
                uVar9 = uVar9 + 1;
                uVar8 = (ulong)ext->N;
                lVar10 = lVar10 + 0x40;
              } while (uVar9 < uVar8);
              uVar9 = (ulong)this->N;
            }
            if (uVar6 < uVar9) {
              do {
                uVar5 = (int)uVar9 * iVar7;
                if (this->arr[uVar5 + uVar6]._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    this->arr[uVar5 + uVar6]._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  uVar9 = (ulong)ext->N;
                  if (ext->N != 0) {
                    lVar10 = 0;
                    uVar8 = 0;
                    do {
                      ::operator*(&local_b8,
                                  (Rational *)
                                  ((long)&ext->arr[(uint)((int)uVar9 * (int)uVar6)]._numerator.
                                          digits.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar10),
                                  this->arr + this->N * iVar7 + uVar6);
                      Rational::operator-=
                                ((Rational *)
                                 ((long)&ext->arr[ext->N * uVar4]._numerator.digits.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10),
                                 &local_b8);
                      if (local_b8._denominator.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_b8._denominator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_b8._numerator.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_b8._numerator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      uVar8 = uVar8 + 1;
                      uVar9 = (ulong)ext->N;
                      lVar10 = lVar10 + 0x40;
                    } while (uVar8 < uVar9);
                  }
                  BigInteger::BigInteger(&local_b8._numerator,0);
                  BigInteger::BigInteger(&local_b8._denominator,1);
                  uVar5 = this->N * iVar7;
                  pRVar2 = this->arr;
                  puVar3 = pRVar2[uVar5 + uVar6]._numerator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pRVar2[uVar5 + uVar6]._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_b8._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  pRVar2[uVar5 + uVar6]._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_b8._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  pRVar2[uVar5 + uVar6]._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_b8._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_b8._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_b8._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_b8._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (puVar3 != (pointer)0x0) {
                    operator_delete(puVar3);
                  }
                  pRVar2[uVar5 + uVar6]._numerator.negative = local_b8._numerator.negative;
                  puVar3 = pRVar2[uVar5 + uVar6]._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pRVar2[uVar5 + uVar6]._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_b8._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  pRVar2[uVar5 + uVar6]._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_b8._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  pRVar2[uVar5 + uVar6]._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_b8._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_b8._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_b8._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_b8._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (puVar3 == (pointer)0x0) {
                    pRVar2[uVar5 + uVar6]._denominator.negative = local_b8._denominator.negative;
                  }
                  else {
                    operator_delete(puVar3);
                    pRVar2[uVar5 + uVar6]._denominator.negative = local_b8._denominator.negative;
                    if (local_b8._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_b8._denominator.digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  if (local_b8._numerator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_b8._numerator.digits.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  uVar9 = (ulong)this->N;
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < uVar9);
            }
            if (local_70._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_70._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar6 = uVar1;
          } while (iVar7 != 0);
        }
        return;
      }
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Cannot inverse a singular matrix");
    }
    else {
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Invalid use of inverseExt");
    }
  }
  else {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Trying to inverse a non-square matrix");
  }
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Matrix<Field>::inverseExt(Matrix &ext)
{
    if(N != M)
        throw matrix_error("Trying to inverse a non-square matrix");
    if(M != ext.M)
    {
        throw matrix_error("Invalid use of inverseExt");
    }
    if(gauss(&ext) != N)
    {
        throw matrix_error("Cannot inverse a singular matrix");
    }
    for(unsigned i = N - 1; i != unsigned(-1); --i)
    {
        Field coeff = Field(1) / (*this)[i][i];
        for(unsigned j = 0; j < N; ++j)
        {
            (*this)[i][j] *= coeff;
        }
        for(unsigned j = 0; j < ext.N; ++j)
        {
            ext[i][j] *= coeff;
        }
        for(unsigned j = i + 1; j < N; j++)
        {
            if(!(*this)[i][j])
                continue;
            for(unsigned q = 0; q < ext.N; q++)
            {
                ext[i][q] -= ext[j][q] * (*this)[i][j];
            }
            (*this)[i][j] = Field();
        }
    }
}